

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O2

int dmgval(monst *magr,obj *otmp,boolean thrown,monst *mdef)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  permonst *ptr;
  boolean bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  obj **ppoVar9;
  int iVar10;
  obj *poVar11;
  bool bVar12;
  
  uVar3 = otmp->otyp;
  cVar1 = otmp->oclass;
  poVar11 = otmp;
  if (cVar1 == '\x02') {
    bVar12 = false;
  }
  else if (cVar1 == '\x06') {
    bVar12 = objects[(short)uVar3].oc_subtyp == '\0';
    poVar11 = (obj *)objects;
  }
  else {
    bVar12 = true;
  }
  iVar10 = (int)poVar11;
  if (uVar3 == 0x120) goto LAB_0026eca1;
  ptr = mdef->data;
  if (magr == &youmonst) {
    ppoVar9 = &uwep;
LAB_0026e85d:
    poVar11 = *ppoVar9;
    if ((poVar11 == (obj *)0x0) || (poVar11->oclass != '\x02')) goto LAB_0026e8ae;
    iVar10 = (byte)objects[poVar11->otyp].oc_subtyp - 0x16;
    if ((2 < (byte)iVar10) ||
       ((((cVar1 != '\r' && (cVar1 != '\x02')) ||
         (2 < (byte)(objects[(short)uVar3].oc_subtyp + 0x18U))) ||
        ((int)objects[(short)uVar3].oc_subtyp != -(uint)(byte)objects[poVar11->otyp].oc_subtyp))))
    goto LAB_0026e8ae;
  }
  else {
    if (magr != (monst *)0x0) {
      ppoVar9 = &magr->mw;
      goto LAB_0026e85d;
    }
LAB_0026e8ae:
    poVar11 = (obj *)0x0;
  }
  if (ptr->msize < 3) {
    if (objects[(short)uVar3].oc_wsdam == '\0') {
      uVar5 = 0;
    }
    else {
      uVar5 = rnd((int)objects[(short)uVar3].oc_wsdam);
    }
    uVar6 = uVar3 - 6;
    if (uVar6 < 0x3b) {
      if ((0x139850c0400000U >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
        iVar10 = 4;
        goto LAB_0026e945;
      }
      if ((0x428008000000401U >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_0026e98b;
LAB_0026e964:
      uVar5 = uVar5 + 1;
    }
    else {
LAB_0026e98b:
      if (uVar3 == 0x219) {
        iVar10 = 6;
LAB_0026e945:
        iVar10 = rnd(iVar10);
        uVar5 = uVar5 + iVar10;
      }
      else if (uVar3 == 0x217) goto LAB_0026e964;
    }
    goto LAB_0026e9b8;
  }
  if (objects[(short)uVar3].oc_wldam == '\0') {
    uVar5 = 0;
  }
  else {
    uVar5 = rnd((int)objects[(short)uVar3].oc_wldam);
  }
  switch(uVar3) {
  case 0x1c:
  case 0x31:
switchD_0026e91a_caseD_1c:
    iVar7 = 4;
    break;
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x26:
  case 0x28:
  case 0x2e:
  case 0x2f:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
    goto switchD_0026e91a_caseD_1d;
  case 0x24:
  case 0x25:
  case 0x2a:
  case 0x2b:
  case 0x3a:
    goto switchD_0026e91a_caseD_24;
  case 0x27:
  case 0x29:
  case 0x33:
    iVar7 = 6;
    break;
  case 0x2c:
  case 0x32:
  case 0x40:
    iVar10 = 4;
    goto LAB_0026e9a1;
  case 0x2d:
  case 0x30:
switchD_0026e91a_caseD_2d:
    iVar10 = 6;
LAB_0026e9a1:
    iVar10 = rnd(iVar10);
    goto LAB_0026e9b1;
  default:
    if (uVar3 != 6) {
      if (uVar3 == 0x10) goto switchD_0026e91a_caseD_1c;
      if (uVar3 == 0x219) goto switchD_0026e91a_caseD_2d;
      if (uVar3 != 0x217) goto switchD_0026e91a_caseD_1d;
    }
    goto switchD_0026e91a_caseD_24;
  }
  iVar10 = dice(iVar7,iVar10);
LAB_0026e9b1:
  uVar5 = uVar5 + iVar10;
switchD_0026e91a_caseD_1d:
LAB_0026e9b8:
  if (!bVar12) {
    uVar5 = uVar5 + (int)otmp->spe;
  }
  if ((((poVar11 != (obj *)0x0 && thrown != '\0') &&
       ((otmp->oclass == '\r' || (otmp->oclass == '\x02')))) &&
      ((byte)(objects[otmp->otyp].oc_subtyp + 0x18U) < 3)) &&
     ((objects[poVar11->otyp].oc_subtyp == '\x17' && (objects[otmp->otyp].oc_subtyp == -0x17)))) {
    uVar5 = uVar5 + (int)poVar11->spe;
  }
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  if (((*(ushort *)&objects[(short)uVar3].field_0x11 & 0x180) == 0) &&
     ((ptr->mflags1 & 0x200000) != 0)) {
    uVar5 = 0;
  }
  uVar6 = 0;
  if ((*(ushort *)&objects[(short)uVar3].field_0x11 & 0x1f0) == 0xe0) {
    uVar6 = uVar5;
  }
  if (ptr != mons + 299) {
    uVar6 = uVar5;
  }
  if (((uVar3 == 0x216) && (uVar6 != 0)) &&
     (iVar10 = otmp->owt - (uint)objects[0x216].oc_weight,
     iVar10 != 0 && (int)(uint)objects[0x216].oc_weight <= (int)otmp->owt)) {
    iVar10 = rnd((iVar10 / 0xa0) * 4);
    uVar6 = iVar10 + uVar6;
    if (0x18 < uVar6) {
      uVar6 = 0x19;
    }
  }
  iVar10 = spec_dbon(otmp,poVar11,thrown,mdef,0x19);
  uVar5 = uVar6;
  if ((thrown != '\0') && (otmp->oclass == '\x02')) {
    bVar2 = objects[otmp->otyp].oc_subtyp;
    if ((byte)(bVar2 + 0x18) < 3) {
      if ((poVar11 != (obj *)0x0) && ((int)objects[poVar11->otyp].oc_subtyp + (int)(char)bVar2 == 0)
         ) {
LAB_0026eb35:
        if ((bVar2 - 0xe5 < 4) && (bVar2 - 0xe5 != 2)) goto LAB_0026eb47;
      }
    }
    else {
      if ((bVar2 & 0xfe) != 0x12) goto LAB_0026eb35;
LAB_0026eb47:
      iVar7 = multishot_max(magr,otmp);
      uVar8 = rnd(iVar7);
      if ((uVar8 < 2) || (iVar10 < 0x19)) {
        uVar5 = uVar6 * uVar8;
      }
      else {
        uVar5 = (uVar8 + 1 >> 1) * uVar6;
        if ((uVar8 & 1) == 0) {
          uVar5 = (uVar6 + 1 >> 1) + uVar5;
        }
      }
    }
  }
  if ((!bVar12) ||
     (((byte)otmp->oclass < 0x11 && ((0x1a000U >> ((byte)otmp->oclass & 0x1f) & 1) != 0)))) {
    uVar6 = 0;
    if (((otmp->field_0x4a & 2) != 0) && (uVar6 = 0, (ptr->mflags2 & 0x202) != 0)) {
      uVar6 = rnd(4);
    }
    if (((byte)(otmp->oclass | 4U) == 6) &&
       (ptr == mons + 0x105 && objects[otmp->otyp].oc_subtyp == '\x03')) {
      iVar7 = rnd(4);
      uVar6 = iVar7 + uVar6;
    }
    if (((*(ushort *)&objects[(short)uVar3].field_0x11 & 0x1f0) == 0xe0) &&
       (bVar4 = hates_silver(ptr), bVar4 != '\0')) {
      iVar7 = rnd(0x14);
      uVar6 = iVar7 + uVar6;
    }
    uVar8 = uVar6 + 1 >> 1;
    if (iVar10 < 0x19) {
      uVar8 = uVar6;
    }
    if (uVar6 < 2) {
      uVar8 = uVar6;
    }
    uVar5 = uVar5 + uVar8;
  }
  if (uVar5 == 0) {
LAB_0026eca1:
    iVar10 = 0;
  }
  else {
    uVar8 = *(uint *)&otmp->field_0x4a >> 8 & 3;
    uVar6 = *(uint *)&otmp->field_0x4a >> 10 & 3;
    if (uVar6 < uVar8) {
      uVar6 = uVar8;
    }
    iVar10 = 1;
    if (1 < (int)(uVar5 - uVar6)) {
      iVar10 = uVar5 - uVar6;
    }
  }
  return iVar10;
switchD_0026e91a_caseD_24:
  uVar5 = uVar5 + 1;
  goto switchD_0026e91a_caseD_1d;
}

Assistant:

int dmgval(struct monst *magr, struct obj *otmp, boolean thrown,
	   struct monst *mdef)
{
	int tmp = 0, otyp = otmp->otyp;
	const struct permonst *ptr = mdef->data;
	boolean Is_weapon = (otmp->oclass == WEAPON_CLASS || is_weptool(otmp));
	boolean double_damage;
	struct obj *olaunch;

	if (otyp == CREAM_PIE) return 0;

	if (magr == &youmonst)
	    olaunch = uwep;
	else if (magr)
	    olaunch = MON_WEP(magr);
	else
	    olaunch = NULL;
	if (olaunch && (!is_launcher(olaunch) ||
			!ammo_and_launcher(otmp, olaunch)))
	    olaunch = NULL;

	if (bigmonst(ptr)) {
	    if (objects[otyp].oc_wldam)
		tmp = rnd(objects[otyp].oc_wldam);
	    switch (otyp) {
		case IRON_CHAIN:
		case CROSSBOW_BOLT:
		case MORNING_STAR:
		case PARTISAN:
		case RUNESWORD:
		case ELVEN_BROADSWORD:
		case BROADSWORD:	tmp++; break;

		case FLAIL:
		case RANSEUR:
		case VOULGE:		tmp += rnd(4); break;

		case ACID_VENOM:
		case HALBERD:
		case SPETUM:		tmp += rnd(6); break;

		case BATTLE_AXE:
		case BARDICHE:
		case TRIDENT:		tmp += dice(2,4); break;

		case TSURUGI:
		case DWARVISH_MATTOCK:
		case TWO_HANDED_SWORD:	tmp += dice(2,6); break;
	    }
	} else {
	    if (objects[otyp].oc_wsdam)
		tmp = rnd(objects[otyp].oc_wsdam);
	    switch (otyp) {
		case IRON_CHAIN:
		case CROSSBOW_BOLT:
		case MACE:
		case WAR_HAMMER:
		case FLAIL:
		case SPETUM:
		case TRIDENT:		tmp++; break;

		case BATTLE_AXE:
		case BARDICHE:
		case BILL_GUISARME:
		case GUISARME:
		case LUCERN_HAMMER:
		case MORNING_STAR:
		case RANSEUR:
		case BROADSWORD:
		case ELVEN_BROADSWORD:
		case RUNESWORD:
		case VOULGE:		tmp += rnd(4); break;

		case ACID_VENOM:	tmp += rnd(6); break;
	    }
	}

	if (Is_weapon) {
		tmp += otmp->spe;
	}
	if (thrown && olaunch && ammo_and_launcher(otmp, olaunch) &&
	    objects[olaunch->otyp].oc_skill == P_SLING) {
		/* sling enchantment affects firing damage */
		tmp += olaunch->spe;
	}
	/* negative enchantments mustn't produce negative damage */
	if (tmp < 0) tmp = 0;

	if (objects[otyp].oc_material <= LEATHER && thick_skinned(ptr))
		/* thick skinned/scaled creatures don't feel it */
		tmp = 0;
	if (ptr == &mons[PM_SHADE] && objects[otyp].oc_material != SILVER)
		tmp = 0;

	/* "very heavy iron ball"; weight increase is in increments of 160 */
	if (otyp == HEAVY_IRON_BALL && tmp > 0) {
	    int wt = (int)objects[HEAVY_IRON_BALL].oc_weight;

	    if ((int)otmp->owt > wt) {
		wt = ((int)otmp->owt - wt) / 160;
		tmp += rnd(4 * wt);
		if (tmp > 25) tmp = 25;	/* objects[].oc_wldam */
	    }
	}

	double_damage = (spec_dbon(otmp, olaunch, thrown, mdef, 25) >= 25);

	/* Damage multiplier to replace multishot for heavy shot projectiles. */
	if (thrown && is_heavyshot(otmp, olaunch)) {
	    int multi_heavy = rnd(multishot_max(magr, otmp));
	    boolean odd_adjusted_multi = FALSE;
	    int old_tmp = tmp;

	    /* Make this cumulative with double damage bonus rather than
	       stacking them, so double damage is effectively +1 multiplier. */
	    if (multi_heavy > 1 && double_damage) {
		odd_adjusted_multi = !!((multi_heavy + 1) & 1);
		multi_heavy = (multi_heavy + 1) / 2;
	    }

	    tmp *= multi_heavy;

	    /* if the multiplier got rounded for double damage adjustment,
	       add the extra half now */
	    if (odd_adjusted_multi && double_damage)
		tmp += (old_tmp + 1) / 2;
	}

/*	Put weapon vs. monster type damage bonuses in below:	*/
	if (Is_weapon || otmp->oclass == GEM_CLASS ||
		otmp->oclass == BALL_CLASS || otmp->oclass == CHAIN_CLASS) {
	    int bonus = 0;

	    if (otmp->blessed && (is_undead(ptr) || is_demon(ptr)))
		bonus += rnd(4);
	    if (is_axe(otmp) && is_wooden(ptr))
		bonus += rnd(4);
	    if (objects[otyp].oc_material == SILVER && hates_silver(ptr))
		bonus += rnd(20);

	    /* if the weapon is going to get a double damage bonus, adjust
	       this bonus so that effectively it's added after the doubling */
	    if (bonus > 1 && double_damage)
		bonus = (bonus + 1) / 2;

	    tmp += bonus;
	}

	if (tmp > 0) {
		/* It's debateable whether a rusted blunt instrument
		   should do less damage than a pristine one, since
		   it will hit with essentially the same impact, but
		   there ought to some penalty for using damaged gear
		   so always subtract erosion even for blunt weapons. */
		tmp -= greatest_erosion(otmp);
		if (tmp < 1) tmp = 1;
	}

	return tmp;
}